

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsPublication
helicsFederateRegisterTypePublication
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_view units_00;
  ValueFederate *pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PublicationObject *pPVar3;
  size_t sVar4;
  Publication *pPVar5;
  HelicsPublication pvVar6;
  _Alloc_hider _Var7;
  _Alloc_hider _Var8;
  string_view name;
  string_view type_00;
  _Head_base<0UL,_helics::PublicationObject_*,_false> local_80;
  PublicationObject *local_78;
  size_type local_70;
  ValueFederate *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  HelicsError *local_50;
  HelicsFederate local_48;
  size_t local_40;
  char *pcStack_38;
  
  local_48 = fed;
  getValueFedSharedPtr(&local_68,(HelicsError *)fed);
  pVVar1 = local_68;
  if (local_68 == (ValueFederate *)0x0) {
    pvVar6 = (HelicsPublication)0x0;
  }
  else {
    local_50 = err;
    pPVar3 = (PublicationObject *)operator_new(0x20);
    (pPVar3->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pPVar3->pubPtr = (Publication *)0x0;
    *(undefined8 *)pPVar3 = 0;
    (pPVar3->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_70 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var8 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    local_78 = pPVar3;
    if (key != (char *)0x0) {
      local_70 = strlen(key);
      _Var8._M_p = key;
    }
    _Var7._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    if (type != (char *)0x0) {
      sVar4 = strlen(type);
      _Var7._M_p = type;
    }
    local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    pcStack_38 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      local_40 = strlen(units);
      pcStack_38 = units;
    }
    units_00._M_str = pcStack_38;
    units_00._M_len = local_40;
    name._M_str = _Var8._M_p;
    name._M_len = local_70;
    type_00._M_str = _Var7._M_p;
    type_00._M_len = sVar4;
    pPVar5 = helics::ValueFederate::registerPublication(pVVar1,name,type_00,units_00);
    p_Var2 = p_Stack_60;
    pVVar1 = local_68;
    pPVar3->pubPtr = pPVar5;
    local_68 = (ValueFederate *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pPVar3->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pPVar3->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pVVar1;
    (pPVar3->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    local_80._M_head_impl = pPVar3;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      local_80._M_head_impl = local_78;
    }
    local_78 = (PublicationObject *)0x0;
    pvVar6 = anon_unknown.dwarf_7c49a::addPublication
                       (local_48,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                                  *)&local_80);
    if (local_80._M_head_impl != (PublicationObject *)0x0) {
      std::default_delete<helics::PublicationObject>::operator()
                ((default_delete<helics::PublicationObject> *)&local_80,local_80._M_head_impl);
    }
    local_80._M_head_impl = (PublicationObject *)0x0;
    if (local_78 != (PublicationObject *)0x0) {
      std::default_delete<helics::PublicationObject>::operator()
                ((default_delete<helics::PublicationObject> *)&local_78,local_78);
    }
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  return pvVar6;
}

Assistant:

HelicsPublication
    helicsFederateRegisterTypePublication(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &fedObj->registerPublication(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}